

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O2

int supports_full_hd(char *monitor)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  object = cJSON_Parse(monitor);
  if (object == (cJSON *)0x0) {
    iVar5 = 0;
    if (global_error_0 != 0) {
      iVar5 = 0;
      fprintf(_stderr,"Error before: %s\n",global_error_0 + global_error_1);
    }
  }
  else {
    pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"name");
    if (((pcVar1 != (cJSON *)0x0) && ((char)pcVar1->type == '\x10')) &&
       (pcVar1->valuestring != (char *)0x0)) {
      printf("Checking monitor \"%s\"\n");
    }
    pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"resolutions");
    iVar4 = 0;
    if (pcVar1 == (cJSON *)0x0) {
      pcVar1 = (cJSON *)0x0;
      goto LAB_00105d65;
    }
    pcVar1 = (cJSON *)&pcVar1->child;
    do {
      do {
        pcVar1 = pcVar1->next;
LAB_00105d65:
        iVar5 = 0;
        if (pcVar1 == (cJSON *)0x0) goto LAB_00105e1f;
        pcVar2 = cJSON_GetObjectItemCaseSensitive(pcVar1,"width");
        pcVar3 = cJSON_GetObjectItemCaseSensitive(pcVar1,"height");
        if (((pcVar2 == (cJSON *)0x0) || (iVar5 = iVar4, (char)pcVar2->type != '\b')) ||
           ((pcVar3 == (cJSON *)0x0 || ((char)pcVar3->type != '\b')))) goto LAB_00105e1f;
        dVar6 = ABS(pcVar2->valuedouble);
        if (dVar6 <= 1920.0) {
          dVar6 = 1920.0;
        }
      } while (dVar6 * 2.220446049250313e-16 < ABS(pcVar2->valuedouble + -1920.0));
      dVar6 = ABS(pcVar3->valuedouble);
      if (dVar6 <= 1080.0) {
        dVar6 = 1080.0;
      }
    } while (dVar6 * 2.220446049250313e-16 < ABS(pcVar3->valuedouble + -1080.0));
    iVar5 = 1;
  }
LAB_00105e1f:
  cJSON_Delete(object);
  return iVar5;
}

Assistant:

static int supports_full_hd(const char * const monitor)
{
    const cJSON *resolution = NULL;
    const cJSON *resolutions = NULL;
    const cJSON *name = NULL;
    int status = 0;
    cJSON *monitor_json = cJSON_Parse(monitor);
    if (monitor_json == NULL)
    {
        const char *error_ptr = cJSON_GetErrorPtr();
        if (error_ptr != NULL)
        {
            fprintf(stderr, "Error before: %s\n", error_ptr);
        }
        status = 0;
        goto end;
    }

    name = cJSON_GetObjectItemCaseSensitive(monitor_json, "name");
    if (cJSON_IsString(name) && (name->valuestring != NULL))
    {
        printf("Checking monitor \"%s\"\n", name->valuestring);
    }

    resolutions = cJSON_GetObjectItemCaseSensitive(monitor_json, "resolutions");
    cJSON_ArrayForEach(resolution, resolutions)
    {
        cJSON *width = cJSON_GetObjectItemCaseSensitive(resolution, "width");
        cJSON *height = cJSON_GetObjectItemCaseSensitive(resolution, "height");

        if (!cJSON_IsNumber(width) || !cJSON_IsNumber(height))
        {
            status = 0;
            goto end;
        }

        if (compare_double(width->valuedouble, 1920) && compare_double(height->valuedouble, 1080))
        {
            status = 1;
            goto end;
        }
    }

end:
    cJSON_Delete(monitor_json);
    return status;
}